

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

int smf::eventcompare(void *a,void *b)

{
  MidiMessage *this;
  MidiMessage *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  this = *a;
  this_00 = *b;
  iVar1 = *(int *)&this_00[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar3 = *(int *)&this[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar4 = 1;
  iVar6 = iVar4;
  if (((((((iVar3 <= iVar1) && (iVar5 = -1, iVar6 = iVar5, iVar1 <= iVar3)) &&
         ((iVar1 = *(int *)&this[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage, iVar1 == 0 ||
          ((iVar3 = *(int *)&this_00[1].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage, iVar6 = iVar4,
           iVar3 == 0 || iVar1 <= iVar3 && (iVar6 = iVar5, iVar3 == 0 || iVar3 <= iVar1)))))) &&
        ((iVar1 = MidiMessage::getP0(this), iVar1 != 0xff ||
         (iVar1 = MidiMessage::getP1(this), iVar6 = iVar4, iVar1 != 0x2f)))) &&
       ((((iVar1 = MidiMessage::getP0(this_00), iVar1 != 0xff ||
          (iVar1 = MidiMessage::getP1(this_00), iVar6 = iVar5, iVar1 != 0x2f)) &&
         ((iVar1 = MidiMessage::getP0(this), iVar1 != 0xff ||
          (iVar1 = MidiMessage::getP0(this_00), iVar6 = iVar5, iVar1 == 0xff)))) &&
        ((iVar1 = MidiMessage::getP0(this), iVar1 == 0xff ||
         (iVar1 = MidiMessage::getP0(this_00), iVar6 = iVar4, iVar1 != 0xff)))))) &&
      ((uVar2 = MidiMessage::getP0(this), (uVar2 & 0xf0) != 0x90 ||
       (iVar1 = MidiMessage::getP2(this), iVar6 = iVar4, iVar1 == 0)))) &&
     (((((uVar2 = MidiMessage::getP0(this_00), (uVar2 & 0xf0) != 0x90 ||
         (iVar1 = MidiMessage::getP2(this_00), iVar6 = iVar5, iVar1 == 0)) &&
        (uVar2 = MidiMessage::getP0(this), iVar6 = iVar4, (uVar2 & 0xf0) != 0x90)) &&
       ((uVar2 = MidiMessage::getP0(this), (uVar2 & 0xf0) != 0x80 &&
        (uVar2 = MidiMessage::getP0(this_00), iVar6 = iVar5, (uVar2 & 0xf0) != 0x90)))) &&
      (uVar2 = MidiMessage::getP0(this_00), (uVar2 & 0xf0) != 0x80)))) {
    uVar2 = MidiMessage::getP0(this);
    iVar6 = 0;
    if (((uVar2 & 0xf0) == 0xb0) &&
       (uVar2 = MidiMessage::getP0(this_00), iVar6 = 0, (uVar2 & 0xf0) == 0xb0)) {
      iVar1 = MidiMessage::getP1(this);
      iVar3 = MidiMessage::getP1(this_00);
      iVar6 = iVar4;
      if (iVar1 <= iVar3) {
        iVar1 = MidiMessage::getP1(this);
        iVar3 = MidiMessage::getP1(this_00);
        iVar6 = iVar5;
        if (iVar3 <= iVar1) {
          iVar1 = MidiMessage::getP2(this);
          iVar3 = MidiMessage::getP2(this_00);
          iVar6 = iVar4;
          if (iVar1 <= iVar3) {
            iVar1 = MidiMessage::getP2(this);
            iVar3 = MidiMessage::getP2(this_00);
            iVar6 = -(uint)(iVar1 < iVar3);
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int eventcompare(const void* a, const void* b) {
	MidiEvent& aevent = **((MidiEvent**)a);
	MidiEvent& bevent = **((MidiEvent**)b);

	if (aevent.tick > bevent.tick) {
		// aevent occurs after bevent
		return +1;
	} else if (aevent.tick < bevent.tick) {
		// aevent occurs before bevent
		return -1;
	} else if ((aevent.seq != 0) && (bevent.seq != 0) && (aevent.seq > bevent.seq)) {
		// aevent sequencing state occurs after bevent
		// see MidiEventList::markSequence()
		return +1;
	} else if ((aevent.seq != 0) && (bevent.seq != 0) && (aevent.seq < bevent.seq)) {
		// aevent sequencing state occurs before bevent
		// see MidiEventList::markSequence()
		return -1;
	} else if (aevent.getP0() == 0xff && aevent.getP1() == 0x2f) {
		// end-of-track meta-message should always be last (but won't really
		// matter since the writing function ignores all end-of-track messages
		// and writes its own.
		return +1;
	} else if (bevent.getP0() == 0xff && bevent.getP1() == 0x2f) {
		// end-of-track meta-message should always be last (but won't really
		// matter since the writing function ignores all end-of-track messages
		// and writes its own.
		return -1;
	} else if (aevent.getP0() == 0xff && bevent.getP0() != 0xff) {
		// other meta-messages are placed before real MIDI messages
		return -1;
	} else if (aevent.getP0() != 0xff && bevent.getP0() == 0xff) {
		// other meta-messages are placed before real MIDI messages
		return +1;
	} else if (((aevent.getP0() & 0xf0) == 0x90) && (aevent.getP2() != 0)) {
		// note-ons come after all other types of MIDI messages
		return +1;
	} else if (((bevent.getP0() & 0xf0) == 0x90) && (bevent.getP2() != 0)) {
		// note-ons come after all other types of MIDI messages
		return -1;
	} else if (((aevent.getP0() & 0xf0) == 0x90) || ((aevent.getP0() & 0xf0) == 0x80)) {
		// note-offs come after all other MIDI messages (except note-ons)
		return +1;
	} else if (((bevent.getP0() & 0xf0) == 0x90) || ((bevent.getP0() & 0xf0) == 0x80)) {
		// note-offs come after all other MIDI messages (except note-ons)
		return -1;
	} else if (((aevent.getP0() & 0xf0) == 0xb0) && ((bevent.getP0() & 0xf0) == 0xb0)) {
		// both events are continuous controllers.  Sort them by controller number
		if (aevent.getP1() > bevent.getP1()) {
			return +1;
		} if (aevent.getP1() < bevent.getP1()) {
			return -1;
		} else {
			// same controller number, so sort by data value
			if (aevent.getP2() > bevent.getP2()) {
				return +1;
			} if (aevent.getP2() < bevent.getP2()) {
				return -1;
			} else {
				return 0;
			}
		}
	} else {
		return 0;
	}
}